

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O0

uint128 CityHash128(char *s,size_t len)

{
  uint64 uVar1;
  uint128 local_58;
  unsigned_long local_48;
  uint64 local_40;
  uint128 local_38;
  size_t local_28;
  size_t len_local;
  char *s_local;
  
  local_28 = len;
  len_local = (size_t)s;
  if (len < 0x10) {
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_58,&k0,&k1);
    _s_local = CityHash128WithSeed(s,len,local_58);
  }
  else {
    local_40 = Fetch64(s);
    uVar1 = Fetch64((char *)(len_local + 8));
    local_48 = uVar1 + 0xc3a5c85c97cb3127;
    std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
              (&local_38,&local_40,&local_48);
    _s_local = CityHash128WithSeed(s + 0x10,len - 0x10,local_38);
  }
  return _s_local;
}

Assistant:

uint128 CityHash128(const char *s, size_t len) {
  return len >= 16 ?
      CityHash128WithSeed(s + 16, len - 16,
                          uint128(Fetch64(s), Fetch64(s + 8) + k0)) :
      CityHash128WithSeed(s, len, uint128(k0, k1));
}